

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Core.c
# Opt level: O2

void Llb_CoreSetVarMaps(Llb_Img_t *p)

{
  uint uVar1;
  int i;
  uint i_00;
  Vec_Int_t *pVVar2;
  Aig_Man_t *pAVar3;
  void *pvVar4;
  int iVar5;
  
  if (p->vVarsCs == (Vec_Int_t *)0x0) {
    __assert_fail("p->vVarsCs != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb2Core.c"
                  ,0x245,"void Llb_CoreSetVarMaps(Llb_Img_t *)");
  }
  if (p->vVarsNs == (Vec_Int_t *)0x0) {
    __assert_fail("p->vVarsNs != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb2Core.c"
                  ,0x246,"void Llb_CoreSetVarMaps(Llb_Img_t *)");
  }
  if (p->vCs2Glo != (Vec_Int_t *)0x0) {
    __assert_fail("p->vCs2Glo == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb2Core.c"
                  ,0x247,"void Llb_CoreSetVarMaps(Llb_Img_t *)");
  }
  if (p->vNs2Glo == (Vec_Int_t *)0x0) {
    if (p->vGlo2Cs != (Vec_Int_t *)0x0) {
      __assert_fail("p->vGlo2Cs == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb2Core.c"
                    ,0x249,"void Llb_CoreSetVarMaps(Llb_Img_t *)");
    }
    if (p->vGlo2Ns == (Vec_Int_t *)0x0) {
      pVVar2 = Vec_IntStartFull(p->pAig->vObjs->nSize);
      p->vCs2Glo = pVVar2;
      pVVar2 = Vec_IntStartFull(p->pAig->vObjs->nSize);
      p->vNs2Glo = pVVar2;
      pVVar2 = Vec_IntStartFull(p->pAig->nRegs);
      p->vGlo2Cs = pVVar2;
      pVVar2 = Vec_IntStartFull(p->pAig->nRegs);
      p->vGlo2Ns = pVVar2;
      iVar5 = 0;
      while( true ) {
        pAVar3 = p->pAig;
        if (pAVar3->nRegs <= iVar5) {
          for (iVar5 = 0; iVar5 < pAVar3->nTruePis; iVar5 = iVar5 + 1) {
            pvVar4 = Vec_PtrEntry(pAVar3->vCis,iVar5);
            Vec_IntWriteEntry(p->vCs2Glo,*(int *)((long)pvVar4 + 0x24),p->pAig->nRegs + iVar5);
            pAVar3 = p->pAig;
          }
          return;
        }
        i = Vec_IntEntry(p->vVarsCs,iVar5);
        i_00 = Vec_IntEntry(p->vVarsNs,iVar5);
        if ((i < 0) || (uVar1 = p->pAig->vObjs->nSize, (int)uVar1 <= i)) break;
        if (((int)i_00 < 0) || (uVar1 <= i_00)) {
          __assert_fail("iVarNs >= 0 && iVarNs < Aig_ManObjNumMax(p->pAig)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb2Core.c"
                        ,0x254,"void Llb_CoreSetVarMaps(Llb_Img_t *)");
        }
        Vec_IntWriteEntry(p->vCs2Glo,i,iVar5);
        Vec_IntWriteEntry(p->vNs2Glo,i_00,iVar5);
        Vec_IntWriteEntry(p->vGlo2Cs,iVar5,i);
        Vec_IntWriteEntry(p->vGlo2Ns,iVar5,i_00);
        iVar5 = iVar5 + 1;
      }
      __assert_fail("iVarCs >= 0 && iVarCs < Aig_ManObjNumMax(p->pAig)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb2Core.c"
                    ,0x253,"void Llb_CoreSetVarMaps(Llb_Img_t *)");
    }
    __assert_fail("p->vGlo2Ns == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb2Core.c"
                  ,0x24a,"void Llb_CoreSetVarMaps(Llb_Img_t *)");
  }
  __assert_fail("p->vNs2Glo == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb2Core.c"
                ,0x248,"void Llb_CoreSetVarMaps(Llb_Img_t *)");
}

Assistant:

void Llb_CoreSetVarMaps( Llb_Img_t * p )
{
    Aig_Obj_t * pObj;
    int i, iVarCs, iVarNs;
    assert( p->vVarsCs != NULL );
    assert( p->vVarsNs != NULL );
    assert( p->vCs2Glo == NULL );
    assert( p->vNs2Glo == NULL );
    assert( p->vGlo2Cs == NULL );
    assert( p->vGlo2Ns == NULL );
    p->vCs2Glo = Vec_IntStartFull( Aig_ManObjNumMax(p->pAig) );
    p->vNs2Glo = Vec_IntStartFull( Aig_ManObjNumMax(p->pAig) );
    p->vGlo2Cs = Vec_IntStartFull( Aig_ManRegNum(p->pAig) );
    p->vGlo2Ns = Vec_IntStartFull( Aig_ManRegNum(p->pAig) );
    for ( i = 0; i < Aig_ManRegNum(p->pAig); i++ )
    {
        iVarCs = Vec_IntEntry( p->vVarsCs, i );
        iVarNs = Vec_IntEntry( p->vVarsNs, i );
        assert( iVarCs >= 0 && iVarCs < Aig_ManObjNumMax(p->pAig) );
        assert( iVarNs >= 0 && iVarNs < Aig_ManObjNumMax(p->pAig) );
        Vec_IntWriteEntry( p->vCs2Glo, iVarCs, i );
        Vec_IntWriteEntry( p->vNs2Glo, iVarNs, i );
        Vec_IntWriteEntry( p->vGlo2Cs, i, iVarCs );
        Vec_IntWriteEntry( p->vGlo2Ns, i, iVarNs );
    }
    // add mapping of the PIs
    Saig_ManForEachPi( p->pAig, pObj, i )
        Vec_IntWriteEntry( p->vCs2Glo, Aig_ObjId(pObj), Aig_ManRegNum(p->pAig)+i );
}